

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<4,_8,_16777232,_false,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::InstanceArrayIntersectorKMB<8>_>,_false>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  undefined8 uVar10;
  ulong uVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  AABBNodeMB4D *node1;
  ulong uVar23;
  ulong uVar24;
  byte bVar25;
  undefined1 (*pauVar26) [32];
  ulong *puVar27;
  uint uVar28;
  ulong uVar29;
  Primitive_conflict4 *prim;
  bool bVar30;
  bool bVar31;
  ulong uVar32;
  ulong uVar33;
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [64];
  undefined1 in_ZMM2 [64];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  vbool<8>_conflict valid0;
  Precalculations pre;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  vbool<8>_conflict local_274b;
  InstanceArrayIntersectorKMB<8> local_274a;
  Precalculations local_2749;
  uint local_2748;
  uint local_2744;
  RayK<8> *local_2740;
  ulong local_2738;
  ulong local_2730;
  RayQueryContext *local_2728;
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined8 local_2610;
  ulong local_2608 [241];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  
  local_2608[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_2608[0] != 8) {
    auVar36 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
    auVar45 = ZEXT816(0) << 0x40;
    uVar32 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar45),5);
    uVar29 = vpcmpeqd_avx512vl(auVar36,(undefined1  [32])valid_i->field_0);
    uVar32 = uVar32 & uVar29;
    bVar25 = (byte)uVar32;
    if (bVar25 != 0) {
      auVar36 = *(undefined1 (*) [32])(ray + 0x80);
      auVar37 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar34 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar40._8_4_ = 0x7fffffff;
      auVar40._0_8_ = 0x7fffffff7fffffff;
      auVar40._12_4_ = 0x7fffffff;
      auVar40._16_4_ = 0x7fffffff;
      auVar40._20_4_ = 0x7fffffff;
      auVar40._24_4_ = 0x7fffffff;
      auVar40._28_4_ = 0x7fffffff;
      local_2740 = ray + 0x100;
      auVar35 = vandps_avx(auVar36,auVar40);
      auVar41._8_4_ = 0x219392ef;
      auVar41._0_8_ = 0x219392ef219392ef;
      auVar41._12_4_ = 0x219392ef;
      auVar41._16_4_ = 0x219392ef;
      auVar41._20_4_ = 0x219392ef;
      auVar41._24_4_ = 0x219392ef;
      auVar41._28_4_ = 0x219392ef;
      uVar29 = vcmpps_avx512vl(auVar35,auVar41,1);
      bVar31 = (bool)((byte)uVar29 & 1);
      auVar35._0_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar36._0_4_;
      bVar31 = (bool)((byte)(uVar29 >> 1) & 1);
      auVar35._4_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar36._4_4_;
      bVar31 = (bool)((byte)(uVar29 >> 2) & 1);
      auVar35._8_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar36._8_4_;
      bVar31 = (bool)((byte)(uVar29 >> 3) & 1);
      auVar35._12_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar36._12_4_;
      bVar31 = (bool)((byte)(uVar29 >> 4) & 1);
      auVar35._16_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar36._16_4_;
      bVar31 = (bool)((byte)(uVar29 >> 5) & 1);
      auVar35._20_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar36._20_4_;
      bVar31 = (bool)((byte)(uVar29 >> 6) & 1);
      auVar35._24_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar36._24_4_;
      bVar31 = SUB81(uVar29 >> 7,0);
      auVar35._28_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar36._28_4_;
      auVar36 = vandps_avx(auVar34,auVar40);
      uVar29 = vcmpps_avx512vl(auVar36,auVar41,1);
      bVar31 = (bool)((byte)uVar29 & 1);
      auVar36._0_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar34._0_4_;
      bVar31 = (bool)((byte)(uVar29 >> 1) & 1);
      auVar36._4_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar34._4_4_;
      bVar31 = (bool)((byte)(uVar29 >> 2) & 1);
      auVar36._8_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar34._8_4_;
      bVar31 = (bool)((byte)(uVar29 >> 3) & 1);
      auVar36._12_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar34._12_4_;
      bVar31 = (bool)((byte)(uVar29 >> 4) & 1);
      auVar36._16_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar34._16_4_;
      bVar31 = (bool)((byte)(uVar29 >> 5) & 1);
      auVar36._20_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar34._20_4_;
      bVar31 = (bool)((byte)(uVar29 >> 6) & 1);
      auVar36._24_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar34._24_4_;
      bVar31 = SUB81(uVar29 >> 7,0);
      auVar36._28_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar34._28_4_;
      auVar34 = vrcp14ps_avx512vl(auVar35);
      auVar42._8_4_ = 0x3f800000;
      auVar42._0_8_ = &DAT_3f8000003f800000;
      auVar42._12_4_ = 0x3f800000;
      auVar42._16_4_ = 0x3f800000;
      auVar42._20_4_ = 0x3f800000;
      auVar42._24_4_ = 0x3f800000;
      auVar42._28_4_ = 0x3f800000;
      auVar13 = vfnmadd213ps_fma(auVar35,auVar34,auVar42);
      auVar35 = vrcp14ps_avx512vl(auVar36);
      auVar14 = vfnmadd213ps_fma(auVar36,auVar35,auVar42);
      local_1e80._8_4_ = 0x7f800000;
      local_1e80._0_8_ = 0x7f8000007f800000;
      local_1e80._12_4_ = 0x7f800000;
      local_1e80._16_4_ = 0x7f800000;
      local_1e80._20_4_ = 0x7f800000;
      local_1e80._24_4_ = 0x7f800000;
      local_1e80._28_4_ = 0x7f800000;
      auVar56 = ZEXT3264(local_1e80);
      auVar36 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),ZEXT1632(auVar45));
      local_1e60._0_4_ = (uint)(bVar25 & 1) * auVar36._0_4_ | (uint)!(bool)(bVar25 & 1) * 0x7f800000
      ;
      bVar31 = (bool)((byte)(uVar32 >> 1) & 1);
      local_1e60._4_4_ = (uint)bVar31 * auVar36._4_4_ | (uint)!bVar31 * 0x7f800000;
      bVar31 = (bool)((byte)(uVar32 >> 2) & 1);
      local_1e60._8_4_ = (uint)bVar31 * auVar36._8_4_ | (uint)!bVar31 * 0x7f800000;
      bVar31 = (bool)((byte)(uVar32 >> 3) & 1);
      local_1e60._12_4_ = (uint)bVar31 * auVar36._12_4_ | (uint)!bVar31 * 0x7f800000;
      bVar31 = (bool)((byte)(uVar32 >> 4) & 1);
      local_1e60._16_4_ = (uint)bVar31 * auVar36._16_4_ | (uint)!bVar31 * 0x7f800000;
      bVar31 = (bool)((byte)(uVar32 >> 5) & 1);
      local_1e60._20_4_ = (uint)bVar31 * auVar36._20_4_ | (uint)!bVar31 * 0x7f800000;
      bVar31 = (bool)((byte)(uVar32 >> 6) & 1);
      local_1e60._24_4_ = (uint)bVar31 * auVar36._24_4_ | (uint)!bVar31 * 0x7f800000;
      bVar31 = SUB81(uVar32 >> 7,0);
      local_1e60._28_4_ = (uint)bVar31 * auVar36._28_4_ | (uint)!bVar31 * 0x7f800000;
      auVar57 = ZEXT3264(local_1e60);
      auVar36 = *(undefined1 (*) [32])ray;
      auVar43._0_8_ = auVar36._0_8_ ^ 0x8000000080000000;
      auVar43._8_4_ = auVar36._8_4_ ^ 0x80000000;
      auVar43._12_4_ = auVar36._12_4_ ^ 0x80000000;
      auVar43._16_4_ = auVar36._16_4_ ^ 0x80000000;
      auVar43._20_4_ = auVar36._20_4_ ^ 0x80000000;
      auVar43._24_4_ = auVar36._24_4_ ^ 0x80000000;
      auVar43._28_4_ = auVar36._28_4_ ^ 0x80000000;
      auVar36 = *(undefined1 (*) [32])(ray + 0x20);
      auVar44._0_8_ = auVar36._0_8_ ^ 0x8000000080000000;
      auVar44._8_4_ = auVar36._8_4_ ^ 0x80000000;
      auVar44._12_4_ = auVar36._12_4_ ^ 0x80000000;
      auVar44._16_4_ = auVar36._16_4_ ^ 0x80000000;
      auVar44._20_4_ = auVar36._20_4_ ^ 0x80000000;
      auVar44._24_4_ = auVar36._24_4_ ^ 0x80000000;
      auVar44._28_4_ = auVar36._28_4_ ^ 0x80000000;
      auVar36 = *(undefined1 (*) [32])(ray + 0x40);
      auVar39._0_8_ = auVar36._0_8_ ^ 0x8000000080000000;
      auVar39._8_4_ = auVar36._8_4_ ^ 0x80000000;
      auVar39._12_4_ = auVar36._12_4_ ^ 0x80000000;
      auVar39._16_4_ = auVar36._16_4_ ^ 0x80000000;
      auVar39._20_4_ = auVar36._20_4_ ^ 0x80000000;
      auVar39._24_4_ = auVar36._24_4_ ^ 0x80000000;
      auVar39._28_4_ = auVar36._28_4_ ^ 0x80000000;
      auVar36 = vandps_avx(auVar37,auVar40);
      uVar29 = vcmpps_avx512vl(auVar36,auVar41,1);
      bVar31 = (bool)((byte)uVar29 & 1);
      auVar38._0_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar37._0_4_;
      bVar31 = (bool)((byte)(uVar29 >> 1) & 1);
      auVar38._4_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar37._4_4_;
      bVar31 = (bool)((byte)(uVar29 >> 2) & 1);
      auVar38._8_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar37._8_4_;
      bVar31 = (bool)((byte)(uVar29 >> 3) & 1);
      auVar38._12_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar37._12_4_;
      bVar31 = (bool)((byte)(uVar29 >> 4) & 1);
      auVar38._16_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar37._16_4_;
      bVar31 = (bool)((byte)(uVar29 >> 5) & 1);
      auVar38._20_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar37._20_4_;
      bVar31 = (bool)((byte)(uVar29 >> 6) & 1);
      auVar38._24_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar37._24_4_;
      bVar31 = SUB81(uVar29 >> 7,0);
      auVar38._28_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar37._28_4_;
      auVar36 = vrcp14ps_avx512vl(auVar38);
      auVar15 = vfnmadd213ps_fma(auVar38,auVar36,auVar42);
      auVar15 = vfmadd132ps_fma(ZEXT1632(auVar15),auVar36,auVar36);
      auVar54 = ZEXT1664(auVar15);
      auVar36 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar58 = ZEXT3264(auVar36);
      auVar37 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar45));
      bVar31 = (bool)((byte)(uVar32 >> 1) & 1);
      bVar30 = (bool)((byte)(uVar32 >> 2) & 1);
      bVar3 = (bool)((byte)(uVar32 >> 3) & 1);
      bVar4 = (bool)((byte)(uVar32 >> 4) & 1);
      bVar5 = (bool)((byte)(uVar32 >> 5) & 1);
      bVar6 = (bool)((byte)(uVar32 >> 6) & 1);
      bVar8 = SUB81(uVar32 >> 7,0);
      auVar59 = ZEXT3264(CONCAT428((uint)bVar8 * auVar37._28_4_ | (uint)!bVar8 * auVar36._28_4_,
                                   CONCAT424((uint)bVar6 * auVar37._24_4_ |
                                             (uint)!bVar6 * auVar36._24_4_,
                                             CONCAT420((uint)bVar5 * auVar37._20_4_ |
                                                       (uint)!bVar5 * auVar36._20_4_,
                                                       CONCAT416((uint)bVar4 * auVar37._16_4_ |
                                                                 (uint)!bVar4 * auVar36._16_4_,
                                                                 CONCAT412((uint)bVar3 *
                                                                           auVar37._12_4_ |
                                                                           (uint)!bVar3 *
                                                                           auVar36._12_4_,
                                                                           CONCAT48((uint)bVar30 *
                                                                                    auVar37._8_4_ |
                                                                                    (uint)!bVar30 *
                                                                                    auVar36._8_4_,
                                                                                    CONCAT44((uint)
                                                  bVar31 * auVar37._4_4_ |
                                                  (uint)!bVar31 * auVar36._4_4_,
                                                  (uint)(bVar25 & 1) * auVar37._0_4_ |
                                                  (uint)!(bool)(bVar25 & 1) * auVar36._0_4_))))))));
      auVar45 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar34,auVar34);
      auVar53 = ZEXT1664(auVar45);
      auVar13 = vfmadd132ps_fma(ZEXT1632(auVar14),auVar35,auVar35);
      auVar55 = ZEXT1664(auVar13);
      local_2744 = (uint)(byte)~bVar25;
      puVar27 = local_2608 + 1;
      pauVar26 = (undefined1 (*) [32])local_1e40;
      local_2610 = 0xfffffffffffffff8;
      auVar36 = vmulps_avx512vl(ZEXT1632(auVar45),auVar43);
      auVar60 = ZEXT3264(auVar36);
      auVar36 = vmulps_avx512vl(ZEXT1632(auVar15),auVar44);
      auVar61 = ZEXT3264(auVar36);
      auVar36 = vmulps_avx512vl(ZEXT1632(auVar13),auVar39);
      auVar62 = ZEXT3264(auVar36);
      local_2728 = context;
LAB_007bbfdf:
      pauVar26 = pauVar26 + -1;
      uVar29 = puVar27[-1];
      puVar27 = puVar27 + -1;
      bVar31 = true;
      if (uVar29 != 0xfffffffffffffff8) {
        auVar36 = *pauVar26;
        local_26c0 = auVar59._0_32_;
        uVar10 = vcmpps_avx512vl(auVar36,local_26c0,1);
        if ((char)uVar10 != '\0') {
          do {
            uVar28 = (uint)uVar29;
            local_2640 = auVar53._0_32_;
            local_26e0 = auVar60._0_32_;
            local_2660 = auVar54._0_32_;
            local_2700 = auVar61._0_32_;
            local_2680 = auVar55._0_32_;
            local_2720 = auVar62._0_32_;
            local_26a0 = auVar57._0_32_;
            if ((uVar29 & 8) != 0) {
              if (uVar29 == 0xfffffffffffffff8) goto LAB_007bc190;
              uVar10 = vcmpps_avx512vl(local_26c0,auVar36,6);
              if ((char)uVar10 != '\0') {
                local_2748 = (uint)uVar32;
                local_274b.v = ~(byte)local_2744;
                local_2730 = (ulong)(uVar28 & 0xf) - 8;
                if (local_2730 == 0) goto LAB_007bc271;
                prim = (Primitive_conflict4 *)(uVar29 & 0xfffffffffffffff0);
                local_2738 = 1;
                goto LAB_007bc22a;
              }
              break;
            }
            uVar23 = uVar29 & 0xfffffffffffffff0;
            auVar46 = ZEXT3264(auVar56._0_32_);
            uVar24 = 0;
            uVar29 = 8;
            do {
              uVar2 = *(ulong *)(uVar23 + uVar24 * 8);
              if (uVar2 != 8) {
                uVar1 = *(undefined4 *)(uVar23 + 0x80 + uVar24 * 4);
                auVar47._4_4_ = uVar1;
                auVar47._0_4_ = uVar1;
                auVar47._8_4_ = uVar1;
                auVar47._12_4_ = uVar1;
                auVar47._16_4_ = uVar1;
                auVar47._20_4_ = uVar1;
                auVar47._24_4_ = uVar1;
                auVar47._28_4_ = uVar1;
                auVar37 = *(undefined1 (*) [32])(ray + 0xe0);
                uVar1 = *(undefined4 *)(uVar23 + 0x20 + uVar24 * 4);
                auVar34._4_4_ = uVar1;
                auVar34._0_4_ = uVar1;
                auVar34._8_4_ = uVar1;
                auVar34._12_4_ = uVar1;
                auVar34._16_4_ = uVar1;
                auVar34._20_4_ = uVar1;
                auVar34._24_4_ = uVar1;
                auVar34._28_4_ = uVar1;
                auVar34 = vfmadd213ps_avx512vl(auVar47,auVar37,auVar34);
                uVar1 = *(undefined4 *)(uVar23 + 0xa0 + uVar24 * 4);
                auVar48._4_4_ = uVar1;
                auVar48._0_4_ = uVar1;
                auVar48._8_4_ = uVar1;
                auVar48._12_4_ = uVar1;
                auVar48._16_4_ = uVar1;
                auVar48._20_4_ = uVar1;
                auVar48._24_4_ = uVar1;
                auVar48._28_4_ = uVar1;
                uVar1 = *(undefined4 *)(uVar23 + 0x40 + uVar24 * 4);
                auVar16._4_4_ = uVar1;
                auVar16._0_4_ = uVar1;
                auVar16._8_4_ = uVar1;
                auVar16._12_4_ = uVar1;
                auVar16._16_4_ = uVar1;
                auVar16._20_4_ = uVar1;
                auVar16._24_4_ = uVar1;
                auVar16._28_4_ = uVar1;
                auVar35 = vfmadd213ps_avx512vl(auVar48,auVar37,auVar16);
                uVar1 = *(undefined4 *)(uVar23 + 0xc0 + uVar24 * 4);
                auVar49._4_4_ = uVar1;
                auVar49._0_4_ = uVar1;
                auVar49._8_4_ = uVar1;
                auVar49._12_4_ = uVar1;
                auVar49._16_4_ = uVar1;
                auVar49._20_4_ = uVar1;
                auVar49._24_4_ = uVar1;
                auVar49._28_4_ = uVar1;
                uVar1 = *(undefined4 *)(uVar23 + 0x60 + uVar24 * 4);
                auVar17._4_4_ = uVar1;
                auVar17._0_4_ = uVar1;
                auVar17._8_4_ = uVar1;
                auVar17._12_4_ = uVar1;
                auVar17._16_4_ = uVar1;
                auVar17._20_4_ = uVar1;
                auVar17._24_4_ = uVar1;
                auVar17._28_4_ = uVar1;
                auVar38 = vfmadd213ps_avx512vl(auVar49,auVar37,auVar17);
                uVar1 = *(undefined4 *)(uVar23 + 0x90 + uVar24 * 4);
                auVar50._4_4_ = uVar1;
                auVar50._0_4_ = uVar1;
                auVar50._8_4_ = uVar1;
                auVar50._12_4_ = uVar1;
                auVar50._16_4_ = uVar1;
                auVar50._20_4_ = uVar1;
                auVar50._24_4_ = uVar1;
                auVar50._28_4_ = uVar1;
                uVar1 = *(undefined4 *)(uVar23 + 0x30 + uVar24 * 4);
                auVar18._4_4_ = uVar1;
                auVar18._0_4_ = uVar1;
                auVar18._8_4_ = uVar1;
                auVar18._12_4_ = uVar1;
                auVar18._16_4_ = uVar1;
                auVar18._20_4_ = uVar1;
                auVar18._24_4_ = uVar1;
                auVar18._28_4_ = uVar1;
                auVar39 = vfmadd213ps_avx512vl(auVar50,auVar37,auVar18);
                uVar1 = *(undefined4 *)(uVar23 + 0xb0 + uVar24 * 4);
                auVar51._4_4_ = uVar1;
                auVar51._0_4_ = uVar1;
                auVar51._8_4_ = uVar1;
                auVar51._12_4_ = uVar1;
                auVar51._16_4_ = uVar1;
                auVar51._20_4_ = uVar1;
                auVar51._24_4_ = uVar1;
                auVar51._28_4_ = uVar1;
                uVar1 = *(undefined4 *)(uVar23 + 0x50 + uVar24 * 4);
                auVar19._4_4_ = uVar1;
                auVar19._0_4_ = uVar1;
                auVar19._8_4_ = uVar1;
                auVar19._12_4_ = uVar1;
                auVar19._16_4_ = uVar1;
                auVar19._20_4_ = uVar1;
                auVar19._24_4_ = uVar1;
                auVar19._28_4_ = uVar1;
                auVar40 = vfmadd213ps_avx512vl(auVar51,auVar37,auVar19);
                uVar1 = *(undefined4 *)(uVar23 + 0xd0 + uVar24 * 4);
                auVar52._4_4_ = uVar1;
                auVar52._0_4_ = uVar1;
                auVar52._8_4_ = uVar1;
                auVar52._12_4_ = uVar1;
                auVar52._16_4_ = uVar1;
                auVar52._20_4_ = uVar1;
                auVar52._24_4_ = uVar1;
                auVar52._28_4_ = uVar1;
                uVar1 = *(undefined4 *)(uVar23 + 0x70 + uVar24 * 4);
                auVar20._4_4_ = uVar1;
                auVar20._0_4_ = uVar1;
                auVar20._8_4_ = uVar1;
                auVar20._12_4_ = uVar1;
                auVar20._16_4_ = uVar1;
                auVar20._20_4_ = uVar1;
                auVar20._24_4_ = uVar1;
                auVar20._28_4_ = uVar1;
                auVar41 = vfmadd213ps_avx512vl(auVar52,auVar37,auVar20);
                auVar42 = vfmadd213ps_avx512vl(auVar34,local_2640,local_26e0);
                auVar43 = vfmadd213ps_avx512vl(auVar35,local_2660,local_2700);
                auVar44 = vfmadd213ps_avx512vl(auVar38,local_2680,local_2720);
                auVar38 = vfmadd213ps_avx512vl(auVar39,local_2640,local_26e0);
                auVar39 = vfmadd213ps_avx512vl(auVar40,local_2660,local_2700);
                auVar40 = vfmadd213ps_avx512vl(auVar41,local_2680,local_2720);
                auVar34 = vpminsd_avx2(auVar42,auVar38);
                auVar35 = vpminsd_avx2(auVar43,auVar39);
                auVar34 = vpmaxsd_avx2(auVar34,auVar35);
                auVar35 = vpminsd_avx2(auVar44,auVar40);
                auVar34 = vpmaxsd_avx2(auVar34,auVar35);
                auVar35 = vpmaxsd_avx2(auVar42,auVar38);
                auVar38 = vpmaxsd_avx2(auVar43,auVar39);
                auVar39 = vpminsd_avx2(auVar35,auVar38);
                auVar35 = vpmaxsd_avx2(auVar44,auVar40);
                auVar38 = vpmaxsd_avx2(auVar34,local_26a0);
                auVar35 = vpminsd_avx512vl(auVar35,local_26c0);
                auVar35 = vpminsd_avx2(auVar39,auVar35);
                uVar33 = vcmpps_avx512vl(auVar38,auVar35,2);
                if ((uVar28 & 7) == 6) {
                  uVar1 = *(undefined4 *)(uVar23 + 0xe0 + uVar24 * 4);
                  auVar21._4_4_ = uVar1;
                  auVar21._0_4_ = uVar1;
                  auVar21._8_4_ = uVar1;
                  auVar21._12_4_ = uVar1;
                  auVar21._16_4_ = uVar1;
                  auVar21._20_4_ = uVar1;
                  auVar21._24_4_ = uVar1;
                  auVar21._28_4_ = uVar1;
                  uVar11 = vcmpps_avx512vl(auVar37,auVar21,0xd);
                  uVar1 = *(undefined4 *)(uVar23 + 0xf0 + uVar24 * 4);
                  auVar22._4_4_ = uVar1;
                  auVar22._0_4_ = uVar1;
                  auVar22._8_4_ = uVar1;
                  auVar22._12_4_ = uVar1;
                  auVar22._16_4_ = uVar1;
                  auVar22._20_4_ = uVar1;
                  auVar22._24_4_ = uVar1;
                  auVar22._28_4_ = uVar1;
                  uVar12 = vcmpps_avx512vl(auVar37,auVar22,1);
                  uVar33 = uVar33 & uVar11 & uVar12;
                }
                uVar11 = vcmpps_avx512vl(local_26c0,auVar36,6);
                uVar33 = uVar33 & uVar11;
                if ((byte)uVar33 != 0) {
                  auVar34 = vblendmps_avx512vl(auVar56._0_32_,auVar34);
                  bVar30 = (bool)((byte)uVar33 & 1);
                  bVar3 = (bool)((byte)(uVar33 >> 1) & 1);
                  bVar4 = (bool)((byte)(uVar33 >> 2) & 1);
                  bVar5 = (bool)((byte)(uVar33 >> 3) & 1);
                  bVar6 = (bool)((byte)(uVar33 >> 4) & 1);
                  bVar8 = (bool)((byte)(uVar33 >> 5) & 1);
                  bVar7 = (bool)((byte)(uVar33 >> 6) & 1);
                  bVar9 = SUB81(uVar33 >> 7,0);
                  if (uVar29 != 8) {
                    *puVar27 = uVar29;
                    puVar27 = puVar27 + 1;
                    *pauVar26 = auVar46._0_32_;
                    pauVar26 = pauVar26 + 1;
                  }
                  auVar46 = ZEXT3264(CONCAT428((uint)bVar9 * auVar34._28_4_ |
                                               (uint)!bVar9 * auVar37._28_4_,
                                               CONCAT424((uint)bVar7 * auVar34._24_4_ |
                                                         (uint)!bVar7 * auVar37._24_4_,
                                                         CONCAT420((uint)bVar8 * auVar34._20_4_ |
                                                                   (uint)!bVar8 * auVar37._20_4_,
                                                                   CONCAT416((uint)bVar6 *
                                                                             auVar34._16_4_ |
                                                                             (uint)!bVar6 *
                                                                             auVar37._16_4_,
                                                                             CONCAT412((uint)bVar5 *
                                                                                       auVar34.
                                                  _12_4_ | (uint)!bVar5 * auVar37._12_4_,
                                                  CONCAT48((uint)bVar4 * auVar34._8_4_ |
                                                           (uint)!bVar4 * auVar37._8_4_,
                                                           CONCAT44((uint)bVar3 * auVar34._4_4_ |
                                                                    (uint)!bVar3 * auVar37._4_4_,
                                                                    (uint)bVar30 * auVar34._0_4_ |
                                                                    (uint)!bVar30 * auVar37._0_4_)))
                                                  )))));
                  uVar29 = uVar2;
                }
              }
            } while ((uVar2 != 8) && (bVar30 = uVar24 < 3, uVar24 = uVar24 + 1, bVar30));
            auVar36 = auVar46._0_32_;
          } while (uVar29 != 8);
        }
        bVar31 = false;
      }
      goto LAB_007bc190;
    }
  }
  return;
  while( true ) {
    prim = prim + 1;
    bVar31 = local_2730 <= local_2738;
    local_2738 = local_2738 + 1;
    if (bVar31) break;
LAB_007bc22a:
    InstanceArrayIntersectorKMB<8>::occluded
              (&local_274a,&local_274b,&local_2749,ray,local_2728,prim);
    local_274b.v = local_274b.v & ~(byte)local_274a;
    if (local_274b.v == 0) break;
  }
LAB_007bc271:
  bVar25 = (byte)local_2744 | ~local_274b.v;
  local_2744 = CONCAT31((int3)(local_2744 >> 8),bVar25);
  if (bVar25 == 0xff) {
    auVar53 = ZEXT3264(local_2640);
    auVar54 = ZEXT3264(local_2660);
    auVar55 = ZEXT3264(local_2680);
    uVar32 = (ulong)local_2748;
    auVar56 = ZEXT3264(CONCAT428(0x7f800000,
                                 CONCAT424(0x7f800000,
                                           CONCAT420(0x7f800000,
                                                     CONCAT416(0x7f800000,
                                                               CONCAT412(0x7f800000,
                                                                         CONCAT48(0x7f800000,
                                                                                  0x7f8000007f800000
                                                                                 )))))));
    auVar57 = ZEXT3264(local_26a0);
    auVar36 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    auVar58 = ZEXT3264(auVar36);
    auVar59 = ZEXT3264(local_26c0);
    auVar60 = ZEXT3264(local_26e0);
    auVar61 = ZEXT3264(local_2700);
    auVar62 = ZEXT3264(local_2720);
    bVar31 = true;
  }
  else {
    auVar36 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    bVar31 = (bool)((byte)(local_2744 >> 1) & 1);
    bVar30 = (bool)((byte)(local_2744 >> 2) & 1);
    bVar3 = (bool)((byte)(local_2744 >> 3) & 1);
    bVar4 = (bool)((byte)(local_2744 >> 4) & 1);
    bVar5 = (bool)((byte)(local_2744 >> 5) & 1);
    bVar6 = (bool)((byte)(local_2744 >> 6) & 1);
    bVar8 = (bool)((byte)(local_2744 >> 7) & 1);
    auVar59 = ZEXT3264(CONCAT428((uint)bVar8 * auVar36._28_4_ | (uint)!bVar8 * local_26c0._28_4_,
                                 CONCAT424((uint)bVar6 * auVar36._24_4_ |
                                           (uint)!bVar6 * local_26c0._24_4_,
                                           CONCAT420((uint)bVar5 * auVar36._20_4_ |
                                                     (uint)!bVar5 * local_26c0._20_4_,
                                                     CONCAT416((uint)bVar4 * auVar36._16_4_ |
                                                               (uint)!bVar4 * local_26c0._16_4_,
                                                               CONCAT412((uint)bVar3 *
                                                                         auVar36._12_4_ |
                                                                         (uint)!bVar3 *
                                                                         local_26c0._12_4_,
                                                                         CONCAT48((uint)bVar30 *
                                                                                  auVar36._8_4_ |
                                                                                  (uint)!bVar30 *
                                                                                  local_26c0._8_4_,
                                                                                  CONCAT44((uint)
                                                  bVar31 * auVar36._4_4_ |
                                                  (uint)!bVar31 * local_26c0._4_4_,
                                                  (uint)(bVar25 & 1) * auVar36._0_4_ |
                                                  (uint)!(bool)(bVar25 & 1) * local_26c0._0_4_))))))
                                ));
    bVar31 = false;
    auVar53 = ZEXT3264(local_2640);
    auVar54 = ZEXT3264(local_2660);
    auVar55 = ZEXT3264(local_2680);
    uVar32 = (ulong)local_2748;
    auVar56 = ZEXT3264(CONCAT428(0x7f800000,
                                 CONCAT424(0x7f800000,
                                           CONCAT420(0x7f800000,
                                                     CONCAT416(0x7f800000,
                                                               CONCAT412(0x7f800000,
                                                                         CONCAT48(0x7f800000,
                                                                                  0x7f8000007f800000
                                                                                 )))))));
    auVar57 = ZEXT3264(local_26a0);
    auVar36 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    auVar58 = ZEXT3264(auVar36);
    auVar60 = ZEXT3264(local_26e0);
    auVar61 = ZEXT3264(local_2700);
    auVar62 = ZEXT3264(local_2720);
  }
LAB_007bc190:
  if (bVar31) {
    bVar25 = (byte)local_2744 & (byte)uVar32;
    bVar31 = (bool)(bVar25 >> 1 & 1);
    bVar30 = (bool)(bVar25 >> 2 & 1);
    bVar3 = (bool)(bVar25 >> 3 & 1);
    bVar4 = (bool)(bVar25 >> 4 & 1);
    bVar5 = (bool)(bVar25 >> 5 & 1);
    bVar6 = (bool)(bVar25 >> 6 & 1);
    *(uint *)local_2740 =
         (uint)(bVar25 & 1) * auVar58._0_4_ | (uint)!(bool)(bVar25 & 1) * *(int *)local_2740;
    *(uint *)(local_2740 + 4) =
         (uint)bVar31 * auVar58._4_4_ | (uint)!bVar31 * *(int *)(local_2740 + 4);
    *(uint *)(local_2740 + 8) =
         (uint)bVar30 * auVar58._8_4_ | (uint)!bVar30 * *(int *)(local_2740 + 8);
    *(uint *)(local_2740 + 0xc) =
         (uint)bVar3 * auVar58._12_4_ | (uint)!bVar3 * *(int *)(local_2740 + 0xc);
    *(uint *)(local_2740 + 0x10) =
         (uint)bVar4 * auVar58._16_4_ | (uint)!bVar4 * *(int *)(local_2740 + 0x10);
    *(uint *)(local_2740 + 0x14) =
         (uint)bVar5 * auVar58._20_4_ | (uint)!bVar5 * *(int *)(local_2740 + 0x14);
    *(uint *)(local_2740 + 0x18) =
         (uint)bVar6 * auVar58._24_4_ | (uint)!bVar6 * *(int *)(local_2740 + 0x18);
    *(uint *)(local_2740 + 0x1c) =
         (uint)(bVar25 >> 7) * auVar58._28_4_ |
         (uint)!(bool)(bVar25 >> 7) * *(int *)(local_2740 + 0x1c);
    return;
  }
  goto LAB_007bbfdf;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }